

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void sysbvm_analysisEnvironment_addInnerFunction
               (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t innerFunction)

{
  sysbvm_tuple_t sVar1;
  
  sVar1 = sysbvm_environment_lookFunctionAnalysisEnvironmentRecursively(context,environment);
  if (sVar1 == 0) {
    sysbvm_error("A function analysis environment is required here.");
  }
  *(undefined8 *)(innerFunction + 0x18) = *(undefined8 *)(sVar1 + 0x88);
  sysbvm_orderedCollection_add(context,*(sysbvm_tuple_t *)(sVar1 + 0xb8),innerFunction);
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisEnvironment_addInnerFunction(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t innerFunction)
{
    sysbvm_tuple_t functionAnalysisEnvironment = sysbvm_environment_lookFunctionAnalysisEnvironmentRecursively(context, environment);
    if(!functionAnalysisEnvironment)
        sysbvm_error("A function analysis environment is required here.");

    sysbvm_functionAnalysisEnvironment_t *functionAnalysisEnvironmentObject = (sysbvm_functionAnalysisEnvironment_t*)functionAnalysisEnvironment;
    sysbvm_functionDefinition_t *innerFunctionDefinitionObject = (sysbvm_functionDefinition_t*)innerFunction;
    innerFunctionDefinitionObject->super.owner = functionAnalysisEnvironmentObject->functionDefinition;
    sysbvm_orderedCollection_add(context, functionAnalysisEnvironmentObject->innerFunctionList, innerFunction);
}